

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib505.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  long lVar3;
  long lVar4;
  stat file_info;
  stat64 local_c0;
  
  if (libtest_arg2 == (char *)0x0) {
    test_cold_8();
  }
  else {
    __stream = fopen64(libtest_arg2,"rb");
    if (__stream == (FILE *)0x0) {
      test_cold_7();
      return -2;
    }
    iVar1 = fileno(__stream);
    iVar1 = fstat64(iVar1,&local_c0);
    if (iVar1 != -1) {
      if (local_c0.st_size == 0) {
        test_cold_5();
        return -4;
      }
      iVar1 = curl_global_init(3);
      if (iVar1 == 0) {
        lVar2 = curl_easy_init();
        if (lVar2 == 0) {
          test_cold_4();
        }
        else {
          lVar3 = curl_slist_append(0,"RNFR 505");
          if (lVar3 == 0) {
            test_cold_3();
          }
          else {
            lVar4 = curl_slist_append(lVar3,"RNTO 505-forreal");
            if (lVar4 != 0) {
              iVar1 = curl_easy_setopt(lVar2,0x2e,1);
              if ((((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0x29,1), iVar1 == 0)) &&
                  (iVar1 = curl_easy_setopt(lVar2,0x2712,URL), iVar1 == 0)) &&
                 (((iVar1 = curl_easy_setopt(lVar2,0x2737,lVar3), iVar1 == 0 &&
                   (iVar1 = curl_easy_setopt(lVar2,0x2719,__stream), iVar1 == 0)) &&
                  (iVar1 = curl_easy_setopt(lVar2,0x75a3,local_c0.st_size), iVar1 == 0)))) {
                iVar1 = curl_easy_perform(lVar2);
              }
              curl_slist_free_all(lVar3);
              fclose(__stream);
              curl_easy_cleanup(lVar2);
              curl_global_cleanup();
              return iVar1;
            }
            test_cold_2();
          }
        }
      }
      else {
        test_cold_1();
      }
      return 0x7e;
    }
    test_cold_6();
  }
  return -1;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  FILE *hd_src ;
  int hd ;
  struct_stat file_info;
  struct curl_slist *hl;
  int error;

  struct curl_slist *headerlist=NULL;
  const char *buf_1 = "RNFR 505";
  const char *buf_2 = "RNTO 505-forreal";

  if (!libtest_arg2) {
    fprintf(stderr, "Usage: <url> <file-to-upload>\n");
    return -1;
  }

  hd_src = fopen(libtest_arg2, "rb");
  if(NULL == hd_src) {
    error = ERRNO;
    fprintf(stderr, "fopen() failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "Error opening file: %s\n", libtest_arg2);
    return -2; /* if this happens things are major weird */
  }

  /* get the file size of the local file */
  hd = fstat(fileno(hd_src), &file_info);
  if(hd == -1) {
    /* can't open file, bail out */
    error = ERRNO;
    fprintf(stderr, "fstat() failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "ERROR: cannot open file %s\n", libtest_arg2);
    fclose(hd_src);
    return -1;
  }

  if(! file_info.st_size) {
    fprintf(stderr, "ERROR: file %s has zero size!\n", libtest_arg2);
    fclose(hd_src);
    return -4;
  }

  if (curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  /* get a curl handle */
  if ((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  /* build a list of commands to pass to libcurl */

  if ((hl = curl_slist_append(headerlist, buf_1)) == NULL) {
    fprintf(stderr, "curl_slist_append() failed\n");
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }
  if ((headerlist = curl_slist_append(hl, buf_2)) == NULL) {
    fprintf(stderr, "curl_slist_append() failed\n");
    curl_slist_free_all(hl);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }
  headerlist = hl;

  /* enable uploading */
  test_setopt(curl, CURLOPT_UPLOAD, 1L);

  /* enable verbose */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* specify target */
  test_setopt(curl,CURLOPT_URL, URL);

  /* pass in that last of FTP commands to run after the transfer */
  test_setopt(curl, CURLOPT_POSTQUOTE, headerlist);

  /* now specify which file to upload */
  test_setopt(curl, CURLOPT_INFILE, hd_src);

  /* and give the size of the upload (optional) */
  test_setopt(curl, CURLOPT_INFILESIZE_LARGE,
                   (curl_off_t)file_info.st_size);

  /* Now run off and do what you've been told! */
  res = curl_easy_perform(curl);

test_cleanup:

  /* clean up the FTP commands list */
  curl_slist_free_all(headerlist);

  /* close the local file */
  fclose(hd_src);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}